

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldRef.c
# Opt level: O3

Vec_Int_t * Gia_ManFlops2Classes(Gia_Man_t *pGia,Vec_Int_t *vFlops)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *__s;
  long lVar6;
  
  iVar1 = pGia->nRegs;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  pVVar5->nCap = iVar4;
  if (iVar4 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar4 << 2);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = iVar1;
  memset(__s,0,(long)iVar1 << 2);
  iVar4 = vFlops->nSize;
  if (0 < (long)iVar4) {
    piVar3 = vFlops->pArray;
    lVar6 = 0;
    do {
      iVar2 = piVar3[lVar6];
      if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      __s[iVar2] = 1;
      lVar6 = lVar6 + 1;
    } while (iVar4 != lVar6);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Gia_ManFlops2Classes( Gia_Man_t * pGia, Vec_Int_t * vFlops )
{
    Vec_Int_t * vFlopClasses;
    int i, Entry;
    vFlopClasses = Vec_IntStart( Gia_ManRegNum(pGia) );
    Vec_IntForEachEntry( vFlops, Entry, i )
        Vec_IntWriteEntry( vFlopClasses, Entry, 1 );
    return vFlopClasses;
}